

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-ssl.c
# Opt level: O3

void lws_ssl_SSL_CTX_destroy(lws_vhost *vhost)

{
  SSL_CTX *pSVar1;
  
  pSVar1 = (SSL_CTX *)(vhost->tls).ssl_ctx;
  if (pSVar1 != (SSL_CTX *)0x0) {
    SSL_CTX_free(pSVar1);
  }
  lws_ssl_destroy_client_ctx(vhost);
  return;
}

Assistant:

void
lws_ssl_SSL_CTX_destroy(struct lws_vhost *vhost)
{
	if (vhost->tls.ssl_ctx)
		SSL_CTX_free(vhost->tls.ssl_ctx);

	lws_ssl_destroy_client_ctx(vhost);

#if defined(LWS_WITH_ACME)
	lws_tls_acme_sni_cert_destroy(vhost);
#endif
}